

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Parameters PVar1;
  int iVar2;
  Incppect<false> *pIVar3;
  long *plVar4;
  char *__s;
  long lVar5;
  int8_t var_int8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int16_t var_int16;
  float var_float;
  int32_t var_int32;
  char *var_str;
  double var_double;
  Parameters parameters;
  int32_t var_arr32 [4];
  string httpRoot;
  undefined1 in_stack_fffffffffffffde8 [15];
  undefined1 in_stack_fffffffffffffdf7;
  duration<long,_std::ratio<1L,_1000L>_> dVar6;
  duration<long,_std::ratio<1L,_1000L>_> dVar7;
  undefined8 in_stack_fffffffffffffe00;
  long in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  long *plVar8;
  undefined1 in_stack_fffffffffffffe20 [24];
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  code *pcVar9;
  undefined8 in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5e;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined1 local_188 [24];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  pointer local_150;
  pointer pbStack_148;
  pointer local_140;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e0;
  long local_d8;
  Parameters local_c0;
  
  printf("Usage: %s [port] [httpRoot]\n",*argv);
  iVar2 = 3000;
  if (1 < argc) {
    iVar2 = atoi(argv[1]);
  }
  if (argc < 3) {
    __s = "../examples";
  }
  else {
    __s = argv[2];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,__s,(allocator<char> *)local_188);
  local_188._4_4_ = 0x40000;
  local_188._8_8_ = 3000;
  local_188._16_4_ = 0x78;
  local_170._M_p = (pointer)&local_160;
  local_160._M_allocated_capacity._0_2_ = 0x2e;
  local_168 = 1;
  local_150 = (pointer)0x0;
  pbStack_148 = (pointer)0x0;
  local_140 = (pointer)0x0;
  local_138._M_p = (pointer)&local_128;
  local_128._M_allocated_capacity._0_4_ = 0x2e79656b;
  local_128._M_allocated_capacity._4_3_ = 0x6d6570;
  local_130 = 7;
  local_128._M_local_buf[7] = '\0';
  local_118._M_p = (pointer)&local_108;
  local_108._M_allocated_capacity = 0x6d65702e74726563;
  local_110 = 8;
  local_108._M_local_buf[8] = '\0';
  dVar7.__r = (rep)&stack0xfffffffffffffe08;
  dVar6.__r = dVar7.__r;
  local_188._0_4_ = iVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffdf8,local_e0,local_d8 + local_e0);
  std::__cxx11::string::append(&stack0xfffffffffffffdf8);
  std::__cxx11::string::operator=((string *)&local_170,(string *)&stack0xfffffffffffffdf8);
  if (dVar6.__r != dVar7.__r) {
    operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe08 + 1);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdf8,"");
  plVar4 = (long *)&stack0xfffffffffffffe28;
  plVar8 = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe18,"index.html","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_150,
             &stack0xfffffffffffffdf8,&stack0xfffffffffffffe38);
  lVar5 = -0x40;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(&local_c0,(Parameters *)local_188);
  PVar1.tLastRequestTimeout_ms._7_1_ = in_stack_fffffffffffffdf7;
  PVar1._0_15_ = in_stack_fffffffffffffde8;
  PVar1._16_8_ = dVar7.__r;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe00;
  PVar1.httpRoot._M_string_length = in_stack_fffffffffffffe08;
  PVar1.httpRoot.field_2._M_allocated_capacity = in_stack_fffffffffffffe10;
  PVar1.httpRoot.field_2._8_8_ = plVar8;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe20;
  PVar1.sslKey._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
  PVar1.sslKey._M_string_length = in_stack_fffffffffffffe40;
  PVar1.sslKey.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
  PVar1.sslKey.field_2._8_8_ = in_stack_fffffffffffffe50;
  PVar1.sslCert._M_dataplus._M_p._0_6_ = in_stack_fffffffffffffe58;
  PVar1.sslCert._M_dataplus._M_p._6_2_ = in_stack_fffffffffffffe5e;
  PVar1.sslCert._M_string_length._0_4_ = in_stack_fffffffffffffe60;
  PVar1.sslCert._M_string_length._4_4_ = in_stack_fffffffffffffe64;
  PVar1.sslCert.field_2._M_allocated_capacity = in_stack_fffffffffffffe68;
  PVar1.sslCert.field_2._8_8_ = in_stack_fffffffffffffe70;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  if ((undefined1 *)dVar7.__r == (undefined1 *)0x0) {
    Incppect<false>::Parameters::~Parameters(&local_c0);
    local_f8 = 0x500000004;
    uStack_f0 = 0x700000006;
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_int8","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:33:45)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_int16","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:34:46)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_int32","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:35:46)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_int32_arr","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:36:50)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_int32_arr[%d]","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:37:54)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_float","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:38:46)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdf8,"var_double","");
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:39:47)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    pIVar3 = Incppect<false>::getInstance();
    dVar7.__r = (rep)&stack0xfffffffffffffe08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdf8,"var_str","")
    ;
    pcVar9 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser/main.cpp:40:44)>
             ::_M_manager;
    Incppect<false>::var((string *)pIVar3,(function *)&stack0xfffffffffffffdf8);
    if (pcVar9 != (code *)0x0) {
      (*pcVar9)(&stack0xfffffffffffffe38,&stack0xfffffffffffffe38,3);
    }
    if ((undefined1 *)dVar7.__r != &stack0xfffffffffffffe08) {
      operator_delete((void *)dVar7.__r,in_stack_fffffffffffffe08 + 1);
    }
    do {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffdf8);
    } while( true );
  }
  std::terminate();
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/hello-browser";
    parameters.resources = { "", "index.html", };

    incppect::getInstance().runAsync(parameters).detach();

    int8_t  var_int8  = 1;
    int16_t var_int16 = 2;
    int32_t var_int32 = 3;
    int32_t var_arr32[4] = { 4, 5, 6, 7 };
    float   var_float = 8.0f;
    double  var_double = 16.0f;

    const char * var_str = "hello browser";

    incppect::getInstance().var("var_int8", [&](auto) { return incppect::view(var_int8); });
    incppect::getInstance().var("var_int16", [&](auto) { return incppect::view(var_int16); });
    incppect::getInstance().var("var_int32", [&](auto) { return incppect::view(var_int32); });
    incppect::getInstance().var("var_int32_arr", [&](auto) { return incppect::view(var_arr32); });
    incppect::getInstance().var("var_int32_arr[%d]", [&](auto idxs) { return incppect::view(var_arr32[idxs[0]]); });
    incppect::getInstance().var("var_float", [&](auto idxs) { return incppect::view(var_float); });
    incppect::getInstance().var("var_double", [&](auto idxs) { return incppect::view(var_double); });
    incppect::getInstance().var("var_str", [&](auto idxs) { return var_str; });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}